

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O3

TCGv_ptr get_fpstatus_ptr_aarch64(TCGContext_conflict1 *tcg_ctx,_Bool is_f16)

{
  TCGTemp *pTVar1;
  undefined7 in_register_00000031;
  
  pTVar1 = tcg_temp_new_internal_aarch64(tcg_ctx,TCG_TYPE_I64,false);
  tcg_gen_addi_i64_aarch64
            (tcg_ctx,(TCGv_i64)((long)pTVar1 - (long)tcg_ctx),(TCGv_i64)tcg_ctx->cpu_env,
             (CONCAT71(in_register_00000031,is_f16) & 0xffffffff) * 8 + 0x2ec8);
  return (TCGv_ptr)((long)pTVar1 - (long)tcg_ctx);
}

Assistant:

static TCGv_ptr get_fpstatus_ptr(TCGContext *tcg_ctx, int neon)
{
    TCGv_ptr statusptr = tcg_temp_new_ptr(tcg_ctx);
    int offset;
    if (neon) {
        offset = offsetof(CPUARMState, vfp.standard_fp_status);
    } else {
        offset = offsetof(CPUARMState, vfp.fp_status);
    }
    tcg_gen_addi_ptr(tcg_ctx, statusptr, tcg_ctx->cpu_env, offset);
    return statusptr;
}